

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

IpEndpointName IpEndpointNameFromSockaddr(sockaddr_in *sockAddr)

{
  uint16_t uVar1;
  uint32_t uVar2;
  IpEndpointName IVar3;
  uint local_34;
  unsigned_long local_28;
  sockaddr_in *sockAddr_local;
  undefined4 local_10;
  
  if ((sockAddr->sin_addr).s_addr == 0) {
    local_28 = 0xffffffff;
  }
  else {
    uVar2 = ntohl((sockAddr->sin_addr).s_addr);
    local_28 = (unsigned_long)uVar2;
  }
  if (sockAddr->sin_port == 0) {
    local_34 = 0xffffffff;
  }
  else {
    uVar1 = ntohs(sockAddr->sin_port);
    local_34 = (uint)uVar1;
  }
  IpEndpointName::IpEndpointName((IpEndpointName *)&sockAddr_local,local_28,local_34);
  IVar3._12_4_ = 0;
  IVar3.address = (unsigned_long)sockAddr_local;
  IVar3.port = local_10;
  return IVar3;
}

Assistant:

static IpEndpointName IpEndpointNameFromSockaddr( const struct sockaddr_in& sockAddr )
{
	return IpEndpointName( 
		(sockAddr.sin_addr.s_addr == INADDR_ANY) 
			? IpEndpointName::ANY_ADDRESS 
			: ntohl( sockAddr.sin_addr.s_addr ),
		(sockAddr.sin_port == 0)
			? IpEndpointName::ANY_PORT
			: ntohs( sockAddr.sin_port )
		);
}